

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O3

RegType asmjit::_abi_1_10::a64::FuncInternal::regTypeFromFpOrVecTypeId(TypeId typeId)

{
  RegType RVar1;
  undefined3 in_register_00000039;
  
  RVar1 = kARM_VecS;
  if (CONCAT31(in_register_00000039,typeId) != 0x2a) {
    if (CONCAT31(in_register_00000039,typeId) == 0x2b) {
      RVar1 = kARM_VecD;
    }
    else if ((9 < (byte)(typeId - _kVec32Start)) &&
            (RVar1 = kARM_VecD, 9 < (byte)(typeId - _kVec64Start))) {
      RVar1 = kARM_VecV;
      if (9 < (byte)(typeId + ~_kVec64End)) {
        RVar1 = kNone;
      }
      return RVar1;
    }
  }
  return RVar1;
}

Assistant:

static RegType regTypeFromFpOrVecTypeId(TypeId typeId) noexcept {
  if (typeId == TypeId::kFloat32)
    return RegType::kARM_VecS;
  else if (typeId == TypeId::kFloat64)
    return RegType::kARM_VecD;
  else if (TypeUtils::isVec32(typeId))
    return RegType::kARM_VecS;
  else if (TypeUtils::isVec64(typeId))
    return RegType::kARM_VecD;
  else if (TypeUtils::isVec128(typeId))
    return RegType::kARM_VecV;
  else
    return RegType::kNone;
}